

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O0

CURLcode Curl_urldecode(SessionHandle *data,char *string,size_t length,char **ostring,size_t *olen,
                       _Bool reject_ctrl)

{
  char *pcVar1;
  char *pcVar2;
  ushort **ppuVar3;
  size_t local_80;
  char *local_78;
  char *ptr;
  char hexstr [3];
  ulong uStack_68;
  CURLcode res;
  unsigned_long hex;
  size_t strindex;
  uchar in;
  char *ns;
  size_t alloc;
  _Bool reject_ctrl_local;
  size_t *olen_local;
  char **ostring_local;
  size_t length_local;
  char *string_local;
  SessionHandle *data_local;
  
  local_80 = length;
  if (length == 0) {
    local_80 = strlen(string);
  }
  ns = (char *)(local_80 + 1);
  pcVar1 = (char *)(*Curl_cmalloc)((size_t)ns);
  hex = 0;
  length_local = (size_t)string;
  if (pcVar1 == (char *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    while (pcVar2 = ns + -1, pcVar2 != (char *)0x0) {
      strindex._7_1_ = *(byte *)length_local;
      if ((((strindex._7_1_ == 0x25) && ((char *)0x2 < pcVar2)) &&
          (ppuVar3 = __ctype_b_loc(),
          ((*ppuVar3)[(int)(uint)*(byte *)(length_local + 1)] & 0x1000) != 0)) &&
         (ppuVar3 = __ctype_b_loc(),
         ((*ppuVar3)[(int)(uint)*(byte *)(length_local + 2)] & 0x1000) != 0)) {
        ptr._1_1_ = *(undefined1 *)(length_local + 1);
        ptr._2_1_ = *(undefined1 *)(length_local + 2);
        ptr._3_1_ = 0;
        uStack_68 = strtoul((char *)((long)&ptr + 1),&local_78,0x10);
        strindex._7_1_ = curlx_ultouc(uStack_68);
        ptr._4_4_ = 0;
        length_local = length_local + 2;
        pcVar2 = ns + -3;
      }
      ns = pcVar2;
      if ((reject_ctrl) && (strindex._7_1_ < 0x20)) {
        (*Curl_cfree)(pcVar1);
        return CURLE_URL_MALFORMAT;
      }
      pcVar1[hex] = strindex._7_1_;
      length_local = length_local + 1;
      hex = hex + 1;
    }
    pcVar1[hex] = '\0';
    if (olen != (size_t *)0x0) {
      *olen = hex;
    }
    *ostring = pcVar1;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_urldecode(struct SessionHandle *data,
                        const char *string, size_t length,
                        char **ostring, size_t *olen,
                        bool reject_ctrl)
{
  size_t alloc = (length?length:strlen(string))+1;
  char *ns = malloc(alloc);
  unsigned char in;
  size_t strindex=0;
  unsigned long hex;
  CURLcode res;

  if(!ns)
    return CURLE_OUT_OF_MEMORY;

  while(--alloc > 0) {
    in = *string;
    if(('%' == in) && (alloc > 2) &&
       ISXDIGIT(string[1]) && ISXDIGIT(string[2])) {
      /* this is two hexadecimal digits following a '%' */
      char hexstr[3];
      char *ptr;
      hexstr[0] = string[1];
      hexstr[1] = string[2];
      hexstr[2] = 0;

      hex = strtoul(hexstr, &ptr, 16);

      in = curlx_ultouc(hex); /* this long is never bigger than 255 anyway */

      res = Curl_convert_from_network(data, &in, 1);
      if(res) {
        /* Curl_convert_from_network calls failf if unsuccessful */
        free(ns);
        return res;
      }

      string+=2;
      alloc-=2;
    }
    if(reject_ctrl && (in < 0x20)) {
      free(ns);
      return CURLE_URL_MALFORMAT;
    }

    ns[strindex++] = in;
    string++;
  }
  ns[strindex]=0; /* terminate it */

  if(olen)
    /* store output size */
    *olen = strindex;

  /* store output string */
  *ostring = ns;

  return CURLE_OK;
}